

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamMultiReader_p.cpp
# Opt level: O3

IMultiMerger * __thiscall
BamTools::Internal::BamMultiReaderPrivate::CreateAlignmentCache(BamMultiReaderPrivate *this)

{
  int iVar1;
  IMultiMerger *pIVar2;
  MergeOrder MVar3;
  undefined **ppuVar4;
  SamHeader header;
  SamHeader local_170;
  
  if (this->m_hasUserMergeOrder == false) {
    GetHeader(&local_170,this);
    if (((local_170.SortOrder._M_string_length != _DAT_001f3fc8) ||
        ((MVar3 = MergeByCoordinate, local_170.SortOrder._M_string_length != 0 &&
         (iVar1 = bcmp(local_170.SortOrder._M_dataplus._M_p,
                       Constants::SAM_HD_SORTORDER_COORDINATE_abi_cxx11_,
                       local_170.SortOrder._M_string_length), iVar1 != 0)))) &&
       ((local_170.SortOrder._M_string_length != DAT_001f3fe8 ||
        ((MVar3 = MergeByName, local_170.SortOrder._M_string_length != 0 &&
         (iVar1 = bcmp(local_170.SortOrder._M_dataplus._M_p,
                       Constants::SAM_HD_SORTORDER_QUERYNAME_abi_cxx11_,
                       local_170.SortOrder._M_string_length), iVar1 != 0)))))) {
      MVar3 = RoundRobinMerge;
    }
    this->m_mergeOrder = MVar3;
    SamHeader::~SamHeader(&local_170);
  }
  MVar3 = this->m_mergeOrder;
  if (MVar3 == RoundRobinMerge) {
    pIVar2 = (IMultiMerger *)operator_new(0x58);
    pIVar2->_vptr_IMultiMerger = (_func_int **)&PTR__MultiMerger_001f1358;
    pIVar2[1]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[2]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[3]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[4]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[5]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[6]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[7]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[8]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[9]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[10]._vptr_IMultiMerger = (_func_int **)0x0;
    std::_Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
    ::_M_initialize_map((_Deque_base<BamTools::Internal::MergeItem,_std::allocator<BamTools::Internal::MergeItem>_>
                         *)(pIVar2 + 1),0);
  }
  else {
    if (MVar3 == MergeByCoordinate) {
      ppuVar4 = &PTR__MultiMerger_001f13d8;
    }
    else {
      if (MVar3 != MergeByName) {
        return (IMultiMerger *)0x0;
      }
      ppuVar4 = &PTR__MultiMerger_001f1448;
    }
    pIVar2 = (IMultiMerger *)operator_new(0x38);
    pIVar2->_vptr_IMultiMerger = (_func_int **)ppuVar4;
    *(undefined4 *)&pIVar2[1]._vptr_IMultiMerger = 0;
    *(undefined4 *)&pIVar2[2]._vptr_IMultiMerger = 0;
    pIVar2[3]._vptr_IMultiMerger = (_func_int **)0x0;
    pIVar2[4]._vptr_IMultiMerger = (_func_int **)(pIVar2 + 2);
    pIVar2[5]._vptr_IMultiMerger = (_func_int **)(pIVar2 + 2);
    pIVar2[6]._vptr_IMultiMerger = (_func_int **)0x0;
  }
  return pIVar2;
}

Assistant:

IMultiMerger* BamMultiReaderPrivate::CreateAlignmentCache()
{

    // if no merge order set explicitly, use SAM header to lookup proper order
    if (!m_hasUserMergeOrder) {

        // fetch SamHeader from BAM files
        SamHeader header = GetHeader();

        // if BAM files are sorted by position
        if (header.SortOrder == Constants::SAM_HD_SORTORDER_COORDINATE)
            m_mergeOrder = BamMultiReader::MergeByCoordinate;

        // if BAM files are sorted by read name
        else if (header.SortOrder == Constants::SAM_HD_SORTORDER_QUERYNAME)
            m_mergeOrder = BamMultiReader::MergeByName;

        // otherwise, sorting is either "unknown" or marked as "unsorted"
        else
            m_mergeOrder = BamMultiReader::RoundRobinMerge;
    }

    // use current merge order to create proper 'multi-merger'
    switch (m_mergeOrder) {

        // merge BAM files by position
        case BamMultiReader::MergeByCoordinate:
            return new MultiMerger<Algorithms::Sort::ByPosition>();

        // merge BAM files by read name
        case BamMultiReader::MergeByName:
            return new MultiMerger<Algorithms::Sort::ByName>();

        // sorting is "unknown", "unsorted" or "ignored"... so use unsorted merger
        case BamMultiReader::RoundRobinMerge:
            return new MultiMerger<Algorithms::Sort::Unsorted>();

        // unknown merge order, can't create merger
        default:
            return 0;
    }
}